

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

int iemgui_dialog(t_iemgui *iemgui,t_symbol **srl,int argc,t_atom *argv)

{
  char *__dest;
  t_iem_fstyle_flags tVar1;
  t_symbol *ptVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  t_iem_fstyle_flags tVar8;
  t_symbol *ptVar9;
  uint uVar10;
  long lVar11;
  t_float tVar12;
  t_float tVar13;
  t_float tVar14;
  t_float tVar15;
  t_float tVar16;
  t_float tVar17;
  char str [144];
  
  tVar12 = atom_getfloatarg(5,argc,argv);
  tVar13 = atom_getfloatarg(10,argc,argv);
  tVar14 = atom_getfloatarg(0xb,argc,argv);
  tVar15 = atom_getfloatarg(0xc,argc,argv);
  tVar16 = atom_getfloatarg(0xd,argc,argv);
  uVar4 = iemgui_getcolorarg(0xe,argc,argv);
  uVar5 = iemgui_getcolorarg(0xf,argc,argv);
  uVar6 = iemgui_getcolorarg(0x10,argc,argv);
  tVar1 = iemgui->x_fsf;
  if (argv[7].a_type == A_FLOAT) {
    ptVar9 = gensym("empty");
LAB_0012ee1c:
    *srl = ptVar9;
  }
  else if (argv[7].a_type == A_SYMBOL) {
    ptVar9 = atom_getsymbolarg(7,argc,argv);
    goto LAB_0012ee1c;
  }
  if (argv[8].a_type == A_FLOAT) {
    ptVar9 = gensym("empty");
LAB_0012ee4c:
    srl[1] = ptVar9;
  }
  else if (argv[8].a_type == A_SYMBOL) {
    ptVar9 = atom_getsymbolarg(8,argc,argv);
    goto LAB_0012ee4c;
  }
  if (argv[9].a_type == A_FLOAT) {
    tVar17 = atom_getfloatarg(9,argc,argv);
    sprintf(str,"%g",SUB84((double)tVar17,0));
    ptVar9 = gensym(str);
LAB_0012eeb7:
    srl[2] = ptVar9;
  }
  else if (argv[9].a_type == A_SYMBOL) {
    ptVar9 = atom_getsymbolarg(9,argc,argv);
    goto LAB_0012eeb7;
  }
  iemgui->x_isa = (t_iem_init_symargs)((uint)iemgui->x_isa & 0xfffffffe | (uint)((int)tVar12 != 0));
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    ptVar9 = srl[lVar11];
    if ((ptVar9 == &s_ || ptVar9 == (t_symbol *)0x0) ||
       (iVar7 = strcmp(ptVar9->s_name,"empty"), iVar7 == 0)) {
      srl[lVar11] = &s_;
    }
  }
  iemgui_all_dollararg2sym(iemgui,srl);
  ptVar9 = iemgui->x_rcv;
  ptVar2 = srl[1];
  if (ptVar9 == (t_symbol *)0x0 || ptVar9 == &s_) {
    if (ptVar2 == (t_symbol *)0x0 || ptVar2 == &s_) {
LAB_0012ef88:
      bVar3 = true;
      goto LAB_0012ef8b;
    }
  }
  else {
    if (ptVar9 == ptVar2) goto LAB_0012ef88;
    pd_unbind((t_pd *)iemgui,ptVar9);
  }
  bVar3 = false;
LAB_0012ef8b:
  ptVar9 = *srl;
  iemgui->x_snd = ptVar9;
  uVar10 = (uint)(ptVar9 != &s_ && ptVar9 != (t_symbol *)0x0) << 7;
  tVar8 = iemgui->x_fsf;
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)tVar8 & 0xffffff7f | uVar10);
  ptVar9 = srl[1];
  iemgui->x_rcv = ptVar9;
  tVar8 = (t_iem_fstyle_flags)
          ((uint)tVar8 & 0xffffff3f | uVar10 |
          (uint)(ptVar9 != &s_ && ptVar9 != (t_symbol *)0x0) << 6);
  iemgui->x_fsf = tVar8;
  iemgui->x_lab = srl[2];
  iemgui->x_lcol = uVar6 & 0xffffff;
  iemgui->x_fcol = uVar5 & 0xffffff;
  iemgui->x_bcol = uVar4 & 0xffffff;
  iemgui->x_ldx = (int)tVar13;
  iemgui->x_ldy = (int)tVar14;
  __dest = iemgui->x_font;
  if ((int)tVar15 == 2) {
    builtin_strncpy(__dest,"times",6);
    uVar4 = 2;
  }
  else if ((int)tVar15 == 1) {
    builtin_strncpy(__dest,"helvetica",10);
    uVar4 = 1;
  }
  else {
    strcpy(__dest,sys_font);
    tVar8 = iemgui->x_fsf;
    uVar4 = 0;
  }
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)tVar8 & 0xffffffc0 | uVar4);
  iVar7 = 4;
  if (4 < (int)tVar16) {
    iVar7 = (int)tVar16;
  }
  iemgui->x_fontsize = iVar7;
  if ((!bVar3) && (ptVar9 = iemgui->x_rcv, ptVar9 != &s_ && ptVar9 != (t_symbol *)0x0)) {
    pd_bind((t_pd *)iemgui,ptVar9);
  }
  iemgui_verify_snd_ne_rcv(iemgui);
  canvas_dirty(iemgui->x_glist,1.0);
  return (uint)tVar1 >> 7 & 1 | (uint)tVar1 >> 5 & 2;
}

Assistant:

int iemgui_dialog(t_iemgui *iemgui, t_symbol **srl, int argc, t_atom *argv)
{
    char str[144];
    int init = (int)atom_getfloatarg(5, argc, argv);
    int ldx = (int)atom_getfloatarg(10, argc, argv);
    int ldy = (int)atom_getfloatarg(11, argc, argv);
    int f = (int)atom_getfloatarg(12, argc, argv);
    int fs = (int)atom_getfloatarg(13, argc, argv);
    int bcol = (int)iemgui_getcolorarg(14, argc, argv);
    int fcol = (int)iemgui_getcolorarg(15, argc, argv);
    int lcol = (int)iemgui_getcolorarg(16, argc, argv);
    int rcv_changed=0, oldsndrcvable=0;
    int i;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;
    if(IS_A_SYMBOL(argv,7))
        srl[0] = atom_getsymbolarg(7, argc, argv);
    else if(IS_A_FLOAT(argv,7))
    {
        srl[0] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,8))
        srl[1] = atom_getsymbolarg(8, argc, argv);
    else if(IS_A_FLOAT(argv,8))
    {
        srl[1] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,9))
        srl[2] = atom_getsymbolarg(9, argc, argv);
    else if(IS_A_FLOAT(argv,9))
    {
        sprintf(str, "%g", atom_getfloatarg(9, argc, argv));
        srl[2] = gensym(str);
    }
    if(init != 0) init = 1;
    iemgui->x_isa.x_loadinit = init;
    for(i=0; i<3; i++)
        if(!srl_is_valid(srl[i]) || (!strcmp(srl[i]->s_name, "empty"))) srl[i] = &s_;

        /* expand dollargs
         * after this, srl holds the $-expanded versions of the labels
         * and iemgui->x_(snd|rcv|lab)_unexpanded hold the unexpanded versions
         */
    iemgui_all_dollararg2sym(iemgui, srl);

        /* check if the receiver changed */
    if(0
       || (!srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1])) /* there was none, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && !(srl_is_valid(srl[1]))) /* there was one, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1]) && iemgui->x_rcv != srl[1])) /* both are valid, but changed */
        rcv_changed = 1;

        /* if the receiver changed (and was previously set), unbind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui->x_snd = srl[0];
    iemgui->x_fsf.x_snd_able = srl_is_valid(srl[0]);
    iemgui->x_rcv = srl[1];
    iemgui->x_fsf.x_rcv_able = srl_is_valid(srl[1]);
    iemgui->x_lab = srl[2];
    iemgui->x_lcol = lcol & 0xffffff;
    iemgui->x_fcol = fcol & 0xffffff;
    iemgui->x_bcol = bcol & 0xffffff;
    iemgui->x_ldx = ldx;
    iemgui->x_ldy = ldy;
    if(f == 1) strcpy(iemgui->x_font, "helvetica");
    else if(f == 2) strcpy(iemgui->x_font, "times");
    else
    {
        f = 0;
        strcpy(iemgui->x_font, sys_font);
    }
    iemgui->x_fsf.x_font_style = f;
    if(fs < 4)
        fs = 4;
    iemgui->x_fontsize = fs;

        /* if the receiver changed (and is now set), bind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_bind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui_verify_snd_ne_rcv(iemgui);
    canvas_dirty(iemgui->x_glist, 1);
    return(oldsndrcvable);
}